

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

bool __thiscall
r_comp::Compiler::read_nil_nb
          (Compiler *this,Ptr *node,uint16_t write_index,uint16_t *extent_index,bool write)

{
  int iVar1;
  Atom *this_00;
  Atom local_24 [4];
  
  iVar1 = std::__cxx11::string::compare
                    ((char *)&((node->
                               super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->cmd);
  if (iVar1 == 0 && write) {
    r_code::Atom::UndefinedFloat();
    this_00 = r_code::vector<r_code::Atom>::operator[]
                        ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)write_index);
    r_code::Atom::operator=(this_00,local_24);
    r_code::Atom::~Atom(local_24);
  }
  return iVar1 == 0;
}

Assistant:

bool Compiler::read_nil_nb(RepliStruct::Ptr node, uint16_t write_index, uint16_t &extent_index, bool write)
{
    if (node->cmd == "|nb") {
        if (write) {
            current_object->code[write_index] = Atom::UndefinedFloat();
        }

        return true;
    }

    return false;
}